

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<unsigned_long> * testing::A<unsigned_long>(void)

{
  void *__s;
  Matcher<unsigned_long> *in_RDI;
  MatcherInterface<unsigned_long> *in_stack_ffffffffffffffd8;
  Matcher<unsigned_long> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<unsigned_long>::AnyMatcherImpl((AnyMatcherImpl<unsigned_long> *)this);
  MakeMatcher<unsigned_long>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }